

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

MOTION_MODE
motion_mode_allowed(WarpedMotionParams *gm_params,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,
                   int allow_warped_motion)

{
  int iVar1;
  int in_ECX;
  MB_MODE_INFO *in_RDX;
  long in_RSI;
  long in_RDI;
  TransformationType gm_type;
  MOTION_MODE local_1;
  
  iVar1 = check_num_overlappable_neighbors(in_RDX);
  if (iVar1 == 0) {
    local_1 = '\0';
  }
  else if ((*(int *)(in_RSI + 0x29e8) == 0) &&
          (iVar1 = is_global_mv_block(in_RDX,*(TransformationType *)
                                              (in_RDI + (long)in_RDX->ref_frame[0] * 0x24 + 0x20)),
          iVar1 != 0)) {
    local_1 = '\0';
  }
  else {
    iVar1 = is_motion_variation_allowed_bsize(in_RDX->bsize);
    if ((((iVar1 == 0) || (iVar1 = is_inter_mode(in_RDX->mode), iVar1 == 0)) ||
        (in_RDX->ref_frame[1] == '\0')) ||
       (iVar1 = is_motion_variation_allowed_compound((MB_MODE_INFO *)0x30b908), iVar1 == 0)) {
      local_1 = '\0';
    }
    else if (((in_RDX->num_proj_ref == '\0') || (in_ECX == 0)) ||
            ((*(int *)(in_RSI + 0x29e8) != 0 ||
             (iVar1 = av1_is_scaled((scale_factors *)in_RDX), iVar1 != 0)))) {
      local_1 = '\x01';
    }
    else {
      local_1 = '\x02';
    }
  }
  return local_1;
}

Assistant:

static inline MOTION_MODE motion_mode_allowed(
    const WarpedMotionParams *gm_params, const MACROBLOCKD *xd,
    const MB_MODE_INFO *mbmi, int allow_warped_motion) {
  if (!check_num_overlappable_neighbors(mbmi)) return SIMPLE_TRANSLATION;
  if (xd->cur_frame_force_integer_mv == 0) {
    const TransformationType gm_type = gm_params[mbmi->ref_frame[0]].wmtype;
    if (is_global_mv_block(mbmi, gm_type)) return SIMPLE_TRANSLATION;
  }
  if (is_motion_variation_allowed_bsize(mbmi->bsize) &&
      is_inter_mode(mbmi->mode) && mbmi->ref_frame[1] != INTRA_FRAME &&
      is_motion_variation_allowed_compound(mbmi)) {
    assert(!has_second_ref(mbmi));
    if (mbmi->num_proj_ref >= 1 && allow_warped_motion &&
        !xd->cur_frame_force_integer_mv &&
        !av1_is_scaled(xd->block_ref_scale_factors[0])) {
      return WARPED_CAUSAL;
    }
    return OBMC_CAUSAL;
  }
  return SIMPLE_TRANSLATION;
}